

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O0

Vec_Ptr_t * Psr_ManReadBlif(char *pFileName)

{
  int iVar1;
  Psr_Man_t *p_00;
  Vec_Ptr_t *t;
  Psr_Man_t *p;
  Vec_Ptr_t *vPrs;
  char *pFileName_local;
  
  p = (Psr_Man_t *)0x0;
  p_00 = Psr_ManAlloc(pFileName);
  if (p_00 == (Psr_Man_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    Psr_NtkAddBlifDirectives(p_00);
    Psr_ManReadLines(p_00);
    iVar1 = Psr_ManErrorPrint(p_00);
    if (iVar1 != 0) {
      p = (Psr_Man_t *)p_00->vNtks;
      p_00->vNtks = (Vec_Ptr_t *)0x0;
    }
    Psr_ManFree(p_00);
    pFileName_local = (char *)p;
  }
  return (Vec_Ptr_t *)pFileName_local;
}

Assistant:

Vec_Ptr_t * Psr_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Psr_Man_t * p = Psr_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Psr_NtkAddBlifDirectives( p );
    Psr_ManReadLines( p );
    if ( Psr_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Psr_ManFree( p );
    return vPrs;
}